

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera_parameters.cpp
# Opt level: O0

tuple<glm::vec<3,_float,_(glm::qualifier)0>,_glm::vec<3,_float,_(glm::qualifier)0>,_glm::vec<3,_float,_(glm::qualifier)0>_>
* __thiscall polyscope::CameraExtrinsics::getCameraFrame(CameraExtrinsics *this)

{
  undefined1 auVar1 [16];
  col_type *this_00;
  float *pfVar2;
  col_type *this_01;
  mat<4,_4,_float,_(glm::qualifier)0> *in_RSI;
  tuple<glm::vec<3,_float,_(glm::qualifier)0>,_glm::vec<3,_float,_(glm::qualifier)0>,_glm::vec<3,_float,_(glm::qualifier)0>_>
  *in_RDI;
  undefined8 uVar5;
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  col_type cVar7;
  vec3 rightDir;
  vec3 upDir;
  vec3 lookDir;
  mat3x3 Rt;
  int j;
  int i;
  mat3x3 R;
  vec<3,_float,_(glm::qualifier)0> *__elements_2;
  mat<3,_3,_float,_(glm::qualifier)0> *in_stack_fffffffffffffec0;
  vec<3,_float,_(glm::qualifier)0> *__elements_1;
  vec<3,_float,_(glm::qualifier)0> *__elements;
  tuple<glm::vec<3,_float,_(glm::qualifier)0>,_glm::vec<3,_float,_(glm::qualifier)0>,_glm::vec<3,_float,_(glm::qualifier)0>_>
  *this_02;
  undefined4 in_stack_fffffffffffffef8;
  float in_stack_fffffffffffffefc;
  tuple<glm::vec<3,_float,_(glm::qualifier)0>,_glm::vec<3,_float,_(glm::qualifier)0>,_glm::vec<3,_float,_(glm::qualifier)0>_>
  *m;
  vec<3,float,(glm::qualifier)0> local_d8 [12];
  undefined8 local_cc;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_c4;
  undefined8 local_c0;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_b8;
  vec<3,_float,_(glm::qualifier)0> local_ac;
  undefined8 local_a0;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_98;
  undefined8 local_90;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_88;
  vec<3,_float,_(glm::qualifier)0> local_7c;
  undefined8 local_70;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_68;
  int local_3c;
  int local_38;
  mat<3,_3,_float,_(glm::qualifier)0> local_34;
  undefined1 auVar6 [56];
  
  m = in_RDI;
  for (local_38 = 0; local_38 < 3; local_38 = local_38 + 1) {
    for (local_3c = 0; local_3c < 3; local_3c = local_3c + 1) {
      this_00 = glm::mat<4,_4,_float,_(glm::qualifier)0>::operator[](in_RSI,local_38);
      pfVar2 = glm::vec<4,_float,_(glm::qualifier)0>::operator[](this_00,local_3c);
      in_stack_fffffffffffffefc = *pfVar2;
      this_01 = glm::mat<3,_3,_float,_(glm::qualifier)0>::operator[](&local_34,local_38);
      pfVar2 = glm::vec<3,_float,_(glm::qualifier)0>::operator[](this_01,local_3c);
      *pfVar2 = in_stack_fffffffffffffefc;
    }
  }
  glm::transpose<3,3,float,(glm::qualifier)0>(in_stack_fffffffffffffec0);
  __elements_2 = &local_7c;
  __elements = (vec<3,_float,_(glm::qualifier)0> *)0x0;
  auVar6 = SUB6456(ZEXT1664((undefined1  [16])0x0),8);
  glm::vec<3,float,(glm::qualifier)0>::vec<double,double,double>
            ((vec<3,float,(glm::qualifier)0> *)__elements_2,0.0,0.0,-1.0);
  cVar7 = glm::operator*((mat<3,_3,_float,_(glm::qualifier)0> *)m,
                         (row_type *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  local_88 = cVar7.field_2;
  auVar3._0_8_ = cVar7._0_8_;
  auVar3._8_56_ = auVar6;
  local_90 = vmovlpd_avx(auVar3._0_16_);
  __elements_1 = &local_ac;
  this_02 = (tuple<glm::vec<3,_float,_(glm::qualifier)0>,_glm::vec<3,_float,_(glm::qualifier)0>,_glm::vec<3,_float,_(glm::qualifier)0>_>
             *)0x3ff0000000000000;
  uVar5 = 0;
  local_70 = local_90;
  local_68 = local_88;
  glm::vec<3,float,(glm::qualifier)0>::vec<double,double,double>
            ((vec<3,float,(glm::qualifier)0> *)__elements_1,(double)__elements,1.0,
             (double)__elements);
  cVar7 = glm::operator*((mat<3,_3,_float,_(glm::qualifier)0> *)m,
                         (row_type *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  local_b8 = cVar7.field_2;
  auVar6 = ZEXT856(0);
  auVar1._8_8_ = uVar5;
  auVar1._0_8_ = cVar7._0_8_;
  local_c0 = vmovlpd_avx(auVar1);
  local_a0 = local_c0;
  local_98 = local_b8;
  glm::vec<3,float,(glm::qualifier)0>::vec<double,double,double>
            (local_d8,(double)this_02,(double)__elements,(double)__elements);
  cVar7 = glm::operator*((mat<3,_3,_float,_(glm::qualifier)0> *)m,
                         (row_type *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  local_c4 = cVar7.field_2;
  auVar4._0_8_ = cVar7._0_8_;
  auVar4._8_56_ = auVar6;
  local_cc = vmovlpd_avx(auVar4._0_16_);
  std::
  tuple<glm::vec<3,_float,_(glm::qualifier)0>,_glm::vec<3,_float,_(glm::qualifier)0>,_glm::vec<3,_float,_(glm::qualifier)0>_>
  ::
  tuple<glm::vec<3,_float,_(glm::qualifier)0>_&,_glm::vec<3,_float,_(glm::qualifier)0>_&,_glm::vec<3,_float,_(glm::qualifier)0>_&,_true,_true>
            (this_02,__elements,__elements_1,__elements_2);
  return in_RDI;
}

Assistant:

std::tuple<glm::vec3, glm::vec3, glm::vec3> CameraExtrinsics::getCameraFrame() const {

  glm::mat3x3 R;
  for (int i = 0; i < 3; i++) {
    for (int j = 0; j < 3; j++) {
      R[i][j] = E[i][j];
    }
  }
  glm::mat3x3 Rt = glm::transpose(R);

  glm::vec3 lookDir = Rt * glm::vec3(0.0, 0.0, -1.0);
  glm::vec3 upDir = Rt * glm::vec3(0.0, 1.0, 0.0);
  glm::vec3 rightDir = Rt * glm::vec3(1.0, 0.0, 0.0);

  return std::tuple<glm::vec3, glm::vec3, glm::vec3>{lookDir, upDir, rightDir};
}